

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::HandleLevel0
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  bool bVar1;
  reference pcVar2;
  const_iterator local_190;
  const_iterator local_188;
  _List_node_base *local_180;
  allocator local_171;
  string local_170;
  cmExpandedCommandArgument local_150;
  allocator local_121;
  string local_120;
  cmExpandedCommandArgument local_100;
  undefined1 local_d1;
  iterator iStack_d0;
  bool value;
  _List_node_base *local_b8;
  _List_node_base *local_b0;
  __normal_iterator<cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
  local_a8;
  const_iterator local_a0;
  _List_node_base *local_98;
  _List_iterator<cmExpandedCommandArgument> local_90;
  iterator argP1;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> newArgs2;
  _Self local_68;
  int local_5c;
  _Self _Stack_58;
  uint depth;
  _List_iterator<cmExpandedCommandArgument> local_50;
  iterator argClose;
  _Self local_40;
  iterator arg;
  int reducible;
  MessageType *status_local;
  string *errorString_local;
  cmArgumentList *newArgs_local;
  cmConditionEvaluator *this_local;
  
  do {
    arg._M_node._4_4_ = 0;
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
         begin(newArgs);
    while( true ) {
      argClose = std::__cxx11::
                 list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                           (newArgs);
      bVar1 = std::operator!=(&local_40,&argClose);
      if (!bVar1) break;
      pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_40);
      bVar1 = IsKeyword(this,&keyParenL_abi_cxx11_,pcVar2);
      if (bVar1) {
        std::_List_iterator<cmExpandedCommandArgument>::_List_iterator(&local_50);
        local_50._M_node = local_40._M_node;
        _Stack_58 = std::_List_iterator<cmExpandedCommandArgument>::operator++(&local_50,0);
        local_5c = 1;
        while( true ) {
          local_68._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                         (newArgs);
          bVar1 = std::operator!=(&local_50,&local_68);
          if (!bVar1 || local_5c == 0) break;
          pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_50);
          bVar1 = IsKeyword(this,&keyParenL_abi_cxx11_,pcVar2);
          if (bVar1) {
            local_5c = local_5c + 1;
          }
          pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_50);
          bVar1 = IsKeyword(this,&keyParenR_abi_cxx11_,pcVar2);
          if (bVar1) {
            local_5c = local_5c + -1;
          }
          std::_List_iterator<cmExpandedCommandArgument>::operator++(&local_50,0);
        }
        if (local_5c != 0) {
          std::__cxx11::string::operator=
                    ((string *)errorString,"mismatched parenthesis in condition");
          *status = FATAL_ERROR;
          return false;
        }
        std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::vector
                  ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                   &argP1);
        local_90._M_node = local_40._M_node;
        local_98 = (_List_node_base *)
                   std::_List_iterator<cmExpandedCommandArgument>::operator++(&local_90,0);
        local_a8._M_current =
             (cmExpandedCommandArgument *)
             std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                       ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                         *)&argP1);
        __gnu_cxx::
        __normal_iterator<cmExpandedCommandArgument_const*,std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>>
        ::__normal_iterator<cmExpandedCommandArgument*>
                  ((__normal_iterator<cmExpandedCommandArgument_const*,std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>>
                    *)&local_a0,&local_a8);
        local_b0 = local_90._M_node;
        local_b8 = local_50._M_node;
        iStack_d0 = std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>
                    ::insert<std::_List_iterator<cmExpandedCommandArgument>,void>
                              ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>
                                *)&argP1,local_a0,local_90,local_50);
        std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::pop_back
                  ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                   &argP1);
        local_d1 = IsTrue(this,(vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                                *)&argP1,errorString,status);
        if ((bool)local_d1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_120,"1",&local_121);
          cmExpandedCommandArgument::cmExpandedCommandArgument(&local_100,&local_120,true);
          pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_40);
          cmExpandedCommandArgument::operator=(pcVar2,&local_100);
          cmExpandedCommandArgument::~cmExpandedCommandArgument(&local_100);
          std::__cxx11::string::~string((string *)&local_120);
          std::allocator<char>::~allocator((allocator<char> *)&local_121);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_170,"0",&local_171);
          cmExpandedCommandArgument::cmExpandedCommandArgument(&local_150,&local_170,true);
          pcVar2 = std::_List_iterator<cmExpandedCommandArgument>::operator*(&local_40);
          cmExpandedCommandArgument::operator=(pcVar2,&local_150);
          cmExpandedCommandArgument::~cmExpandedCommandArgument(&local_150);
          std::__cxx11::string::~string((string *)&local_170);
          std::allocator<char>::~allocator((allocator<char> *)&local_171);
        }
        local_90._M_node = local_40._M_node;
        local_180 = (_List_node_base *)
                    std::_List_iterator<cmExpandedCommandArgument>::operator++(&local_90,0);
        std::_List_const_iterator<cmExpandedCommandArgument>::_List_const_iterator
                  (&local_188,&local_90);
        std::_List_const_iterator<cmExpandedCommandArgument>::_List_const_iterator
                  (&local_190,&local_50);
        std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
        erase(newArgs,local_188,local_190);
        std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::~vector
                  ((vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
                   &argP1);
      }
      std::_List_iterator<cmExpandedCommandArgument>::operator++(&local_40);
    }
    if (arg._M_node._4_4_ == 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel0(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        cmake::MessageType& status)
{
  int reducible;
  do {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    while (arg != newArgs.end()) {
      if (IsKeyword(keyParenL, *arg)) {
        // search for the closing paren for this opening one
        cmArgumentList::iterator argClose;
        argClose = arg;
        argClose++;
        unsigned int depth = 1;
        while (argClose != newArgs.end() && depth) {
          if (this->IsKeyword(keyParenL, *argClose)) {
            depth++;
          }
          if (this->IsKeyword(keyParenR, *argClose)) {
            depth--;
          }
          argClose++;
        }
        if (depth) {
          errorString = "mismatched parenthesis in condition";
          status = cmake::FATAL_ERROR;
          return false;
        }
        // store the reduced args in this vector
        std::vector<cmExpandedCommandArgument> newArgs2;

        // copy to the list structure
        cmArgumentList::iterator argP1 = arg;
        argP1++;
        newArgs2.insert(newArgs2.end(), argP1, argClose);
        newArgs2.pop_back();
        // now recursively invoke IsTrue to handle the values inside the
        // parenthetical expression
        bool value = this->IsTrue(newArgs2, errorString, status);
        if (value) {
          *arg = cmExpandedCommandArgument("1", true);
        } else {
          *arg = cmExpandedCommandArgument("0", true);
        }
        argP1 = arg;
        argP1++;
        // remove the now evaluated parenthetical expression
        newArgs.erase(argP1, argClose);
      }
      ++arg;
    }
  } while (reducible);
  return true;
}